

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O2

int nni_sock_find(nni_sock **sockp,uint32_t id)

{
  nni_sock *pnVar1;
  int iVar2;
  
  nni_mtx_lock(&sock_lk);
  pnVar1 = (nni_sock *)nni_id_get(&sock_ids,(ulong)id);
  iVar2 = 7;
  if ((pnVar1 != (nni_sock *)0x0) && (pnVar1->s_closed == false)) {
    pnVar1->s_ref = pnVar1->s_ref + 1;
    *sockp = pnVar1;
    iVar2 = 0;
  }
  nni_mtx_unlock(&sock_lk);
  return iVar2;
}

Assistant:

int
nni_sock_find(nni_sock **sockp, uint32_t id)
{
	int       rv = 0;
	nni_sock *s;

	nni_mtx_lock(&sock_lk);
	if ((s = nni_id_get(&sock_ids, id)) != NULL) {
		if (s->s_closed) {
			rv = NNG_ECLOSED;
		} else {
			s->s_ref++;
			*sockp = s;
		}
	} else {
		rv = NNG_ECLOSED;
	}
	nni_mtx_unlock(&sock_lk);

	return (rv);
}